

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu541.c
# Opt level: O3

MPP_RET hal_h264e_vepu541_start(void *hal,HalEncTask *task)

{
  MPP_RET MVar1;
  MPP_RET MVar2;
  char *fmt;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  long local_40 [3];
  undefined8 local_28;
  
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter %p\n","hal_h264e_vepu541_start",hal);
  }
  local_40[2] = (long)hal + 0x500;
  local_28 = 0x100040000030c;
  MVar1 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,local_40 + 2);
  if (MVar1 == MPP_OK) {
    local_40[2] = (long)hal + 0x1b8;
    local_28 = 0x348;
    MVar1 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,local_40 + 2);
    if (MVar1 != MPP_OK) goto LAB_0021e35e;
    local_40[0] = (long)hal + 0x80c;
    local_40[1] = 0x1c00000004;
    MVar1 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),5,local_40);
    if (MVar1 == MPP_OK) {
      local_40[0] = (long)hal + 0x810;
      local_40[1] = 0x21000000134;
      MVar1 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),5,local_40);
      if (MVar1 == MPP_OK) {
        MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),0xf,(void *)0x0);
        MVar1 = MPP_OK;
        if (MVar2 != MPP_OK) {
          _mpp_log_l(2,"hal_h264e_vepu541","send cmd failed %d\n","hal_h264e_vepu541_start",
                     (ulong)(uint)MVar2);
          MVar1 = MVar2;
        }
        goto LAB_0021e385;
      }
    }
    fmt = "set register read failed %d\n";
  }
  else {
LAB_0021e35e:
    fmt = "set register write failed %d\n";
  }
  _mpp_log_l(2,"hal_h264e_vepu541",fmt,"hal_h264e_vepu541_start",(ulong)(uint)MVar1);
LAB_0021e385:
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave %p\n","hal_h264e_vepu541_start",hal);
  }
  return MVar1;
}

Assistant:

static MPP_RET hal_h264e_vepu541_start(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalH264eVepu541Ctx *ctx = (HalH264eVepu541Ctx *)hal;

    (void) task;

    hal_h264e_dbg_func("enter %p\n", hal);

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        /* write L2 registers */
        wr_cfg.reg = &ctx->regs_l2_set;
        wr_cfg.size = sizeof(Vepu541H264eRegL2Set);
        wr_cfg.offset = VEPU541_REG_BASE_L2;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        /* write L1 registers */
        wr_cfg.reg = &ctx->regs_set;
        wr_cfg.size = sizeof(Vepu541H264eRegSet);
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        /* set output request */
        rd_cfg.reg = &ctx->regs_ret.hw_status;
        rd_cfg.size = sizeof(RK_U32);
        rd_cfg.offset = VEPU541_REG_BASE_HW_STATUS;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &ctx->regs_ret.st_bsl;
        rd_cfg.size = sizeof(ctx->regs_ret) - 4;
        rd_cfg.offset = VEPU541_REG_BASE_STATISTICS;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        /* send request to hardware */
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    hal_h264e_dbg_func("leave %p\n", hal);

    return ret;
}